

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O1

ssize_t __thiscall
ControlProtocolState::read(ControlProtocolState *this,int __fd,void *__buf,size_t __nbytes)

{
  string *__rhs;
  size_t __n;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined4 in_register_00000034;
  void *pvVar5;
  void *__s;
  uint local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __s = (void *)CONCAT44(in_register_00000034,__fd);
  __rhs = &this->partialMsg;
  do {
    paVar4 = &local_50.field_2;
    if (__buf == (void *)0x0) {
      local_5c = 0;
      break;
    }
    pvVar3 = memchr(__s,10,(size_t)__buf);
    pvVar5 = (void *)((long)pvVar3 - (long)__s);
    if (pvVar5 == (void *)0xffffffffffffffff || pvVar3 == (void *)0x0) {
      if (this->maxLength < (this->partialMsg)._M_string_length + (long)__buf) {
        (this->partialMsg)._M_string_length = 0;
        *(this->partialMsg)._M_dataplus._M_p = '\0';
        local_5c = 0xffffffff;
        if (__nbytes == 0) {
LAB_00174ebb:
          local_5c = 0xffffffff;
          bVar1 = false;
        }
        else {
          bVar1 = false;
          std::__cxx11::string::_M_replace(__nbytes,0,*(char **)(__nbytes + 8),0x1d1ea4);
        }
      }
      else {
        local_50._M_dataplus._M_p = (pointer)paVar4;
        if (__s == (void *)0x0) {
          local_50._M_string_length = 0;
          local_50.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,__s,(long)__s + (long)__buf);
        }
        std::__cxx11::string::_M_append((char *)__rhs,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar4) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        bVar1 = false;
        local_5c = 0;
      }
    }
    else {
      std::__cxx11::string::append((char *)__rhs,(ulong)__s);
      if (this->negotiated == false) {
        iVar2 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar2 != 0) {
          if (__nbytes != 0) {
            std::operator+(&local_50,"unsupported protocol: ",__rhs);
            std::__cxx11::string::operator=((string *)__nbytes,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                       local_50.field_2._M_local_buf[0]) + 1);
            }
          }
          (this->partialMsg)._M_string_length = 0;
          *(this->partialMsg)._M_dataplus._M_p = '\0';
          goto LAB_00174ebb;
        }
        this->negotiated = true;
        (this->partialMsg)._M_string_length = 0;
        *(this->partialMsg)._M_dataplus._M_p = '\0';
        if (__buf <= pvVar5) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        __s = (void *)((long)__s + (long)pvVar5 + 1);
        __buf = (void *)((long)__buf - ((long)pvVar5 + 1));
        bVar1 = true;
      }
      else {
        __n = (this->partialMsg)._M_string_length;
        if ((__n == (this->controlID)._M_string_length) &&
           ((__n == 0 ||
            (iVar2 = bcmp((this->partialMsg)._M_dataplus._M_p,(this->controlID)._M_dataplus._M_p,__n
                         ), iVar2 == 0)))) {
          this->releaseSeen = true;
        }
        if (__nbytes != 0) {
          std::__cxx11::string::_M_replace(__nbytes,0,*(char **)(__nbytes + 8),0x1d1ede);
        }
        (this->partialMsg)._M_string_length = 0;
        *(this->partialMsg)._M_dataplus._M_p = '\0';
        local_5c = 1;
        bVar1 = false;
      }
    }
  } while (bVar1);
  return (ulong)local_5c;
}

Assistant:

int read(StringRef buf, std::string* errstr = nullptr) {
    while (buf.size()) {
      size_t nl = buf.find('\n');
      if (nl == StringRef::npos) {
        if (partialMsg.size() + buf.size() > maxLength) {
          // protocol fault, msg length exceeded maximum
          partialMsg.clear();
          if (errstr) {
            *errstr = "excessive message length";
          }
          return -1;
        }

        // incomplete msg, store and continue
        partialMsg += buf.str();
        return 0;
      }

      partialMsg += buf.slice(0, nl);

      if (!negotiated) {
        // negotiate protocol version
        if (partialMsg != "llbuild.1") {
          // incompatible protocol version
          if (errstr) {
            *errstr = "unsupported protocol: " + partialMsg;
          }
          partialMsg.clear();
          return -1;
        }
        negotiated = true;
      } else {
        // check for supported control message
        if (partialMsg == controlID) {
          releaseSeen = true;
        }

        // We halt receiving anything after the first control message
        if (errstr) {
          *errstr = "bad ID";
        }
        partialMsg.clear();
        return 1;
      }

      partialMsg.clear();
      buf = buf.drop_front(nl + 1);
    }
    return 0;
  }